

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O3

boolean canletgo(obj *obj,char *word)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  
  if ((obj->owornmask & 0xf007fU) == 0) {
    if (obj->otyp == 0xf1) {
      if (obj->corpsenm != 0) {
        if (*word == '\0') {
          return '\0';
        }
        word = body_part(6);
        pcVar4 = "The leash is tied around your %s.";
        goto LAB_0016e512;
      }
    }
    else if ((obj->otyp == 0x210) && (uVar2 = *(uint *)&obj->field_0x4a, (uVar2 & 1) != 0)) {
      if (*word != '\0') {
        iVar1 = strcmp(word,"throw");
        if (1 < obj->quan && iVar1 == 0) {
          obj->corpsenm = 1;
        }
        pcVar4 = " any of";
        if (obj->corpsenm == 0) {
          pcVar4 = "";
        }
        pcVar3 = "s";
        if (obj->quan == 1) {
          pcVar3 = "";
        }
        pline("For some reason, you cannot %s%s the stone%s!",word,pcVar4,pcVar3);
        uVar2 = *(uint *)&obj->field_0x4a;
      }
      obj->corpsenm = 0;
      *(uint *)&obj->field_0x4a = uVar2 | 0x40;
      return '\0';
    }
    if (((uint)obj->owornmask >> 0x14 & 1) == 0) {
      return '\x01';
    }
    if (*word != '\0') {
      pcVar4 = "You cannot %s something you are sitting on.";
LAB_0016e512:
      pline(pcVar4,word);
      return '\0';
    }
  }
  else if (*word != '\0') {
    Norep("You cannot %s something you are wearing.",word);
    return '\0';
  }
  return '\0';
}

Assistant:

boolean canletgo(struct obj *obj, const char *word)
{
	if (obj->owornmask & (W_ARMOR | W_RING | W_AMUL | W_TOOL)){
		if (*word)
			Norep("You cannot %s something you are wearing.", word);
		return FALSE;
	}
	if (obj->otyp == LOADSTONE && obj->cursed) {
		/* getobj() kludge sets corpsenm to user's specified count
		   when refusing to split a stack of cursed loadstones */
		if (*word) {
			/* getobj() ignores a count for throwing since that is
			   implicitly forced to be 1; replicate its kludge... */
			if (!strcmp(word, "throw") && obj->quan > 1L)
			    obj->corpsenm = 1;
			pline("For some reason, you cannot %s%s the stone%s!",
			      word, obj->corpsenm ? " any of" : "",
			      plur(obj->quan));
		}
		obj->corpsenm = 0;		/* reset */
		obj->bknown = 1;
		return FALSE;
	}
	if (obj->otyp == LEASH && obj->leashmon != 0) {
		if (*word)
			pline("The leash is tied around your %s.",
					body_part(HAND));
		return FALSE;
	}
	if (obj->owornmask & W_SADDLE) {
		if (*word)
			pline("You cannot %s something you are sitting on.", word);
		return FALSE;
	}
	return TRUE;
}